

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O2

void lj_serialize_dict_prep_str(lua_State *L,GCtab *dict)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  MSize MVar4;
  long lVar5;
  cTValue *pcVar6;
  TValue *pTVar7;
  uint32_t hbits;
  long lVar8;
  ulong uVar9;
  
  if (dict->hmask == 0) {
    MVar4 = lj_tab_len(dict);
    if (MVar4 != 0) {
      uVar3 = 0x1f;
      if (MVar4 - 1 != 0) {
        for (; MVar4 - 1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      hbits = (uVar3 ^ 0xffffffe0) + 0x21;
      if (MVar4 == 1) {
        hbits = 1;
      }
      lj_tab_resize(L,dict,dict->asize,hbits);
      lVar8 = 8;
      for (uVar9 = 1; (MVar4 + 1 != uVar9 && (uVar9 < dict->asize)); uVar9 = uVar9 + 1) {
        uVar1 = (dict->array).ptr64;
        uVar2 = *(ulong *)(uVar1 + uVar9 * 8);
        lVar5 = (long)uVar2 >> 0x2f;
        if (lVar5 != -2) {
          if (lVar5 != -5) {
            lj_err_caller(L,LJ_ERR_BUFFER_BADOPT);
          }
          pcVar6 = lj_tab_getstr(dict,(GCstr *)(uVar2 & 0x7fffffffffff));
          if (pcVar6 == (cTValue *)0x0) {
            pTVar7 = lj_tab_newkey(L,dict,(cTValue *)(uVar1 + lVar8));
            pTVar7->u64 = uVar9 - 1;
          }
        }
        lVar8 = lVar8 + 8;
      }
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_serialize_dict_prep_str(lua_State *L, GCtab *dict)
{
  if (!dict->hmask) {  /* No hash part means not prepared, yet. */
    MSize i, len = lj_tab_len(dict);
    if (!len) return;
    lj_tab_resize(L, dict, dict->asize, hsize2hbits(len));
    for (i = 1; i <= len && i < dict->asize; i++) {
      cTValue *o = arrayslot(dict, i);
      if (tvisstr(o)) {
	if (!lj_tab_getstr(dict, strV(o))) {  /* Ignore dups. */
	  lj_tab_newkey(L, dict, o)->u64 = (uint64_t)(i-1);
	}
      } else if (!tvisfalse(o)) {
	lj_err_caller(L, LJ_ERR_BUFFER_BADOPT);
      }
    }
  }
}